

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

unique_ptr<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>_> __thiscall
anon_unknown.dwarf_13061b0::CreateInstallFileSetGenerator
          (anon_unknown_dwarf_13061b0 *this,Helper *helper,cmTarget *target,cmFileSet *fileSet,
          string *destination,cmInstallCommandArguments *args)

{
  string *__args_1;
  string *__args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_5;
  string *__args_6;
  __uniq_ptr_impl<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>_> _Var1;
  __uniq_ptr_data<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>,_true,_true>
  extraout_RAX;
  bool local_5e;
  undefined1 local_5d;
  MessageLevel message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string *local_50;
  cmFileSet *fileSet_local;
  undefined8 local_38;
  
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_50 = destination;
  fileSet_local = fileSet;
  message = cmInstallGenerator::SelectMessageLevel(helper->Makefile,false);
  __args_1 = cmTarget::GetName_abi_cxx11_(target);
  __args_4 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  __args_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  __args_6 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  local_5e = cmInstallCommandArguments::GetExcludeFromAll(args);
  local_5d = cmInstallCommandArguments::GetOptional(args);
  cmMakefile::GetBacktrace(helper->Makefile);
  _Var1._M_t.
  super__Tuple_impl<0UL,_cmInstallFileSetGenerator_*,_std::default_delete<cmInstallFileSetGenerator>_>
  .super__Head_base<0UL,_cmInstallFileSetGenerator_*,_false>._M_head_impl =
       (tuple<cmInstallFileSetGenerator_*,_std::default_delete<cmInstallFileSetGenerator>_>)
       std::
       make_unique<cmInstallFileSetGenerator,std::__cxx11::string_const&,cmFileSet*&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,bool,cmListFileBacktrace>
                 (local_58,(cmFileSet **)__args_1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &fileSet_local,local_50,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__args_4,__args_5,(MessageLevel *)__args_6,(bool *)&message,&local_5e,
                  (cmListFileBacktrace *)&local_5d);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    _Var1._M_t.
    super__Tuple_impl<0UL,_cmInstallFileSetGenerator_*,_std::default_delete<cmInstallFileSetGenerator>_>
    .super__Head_base<0UL,_cmInstallFileSetGenerator_*,_false>._M_head_impl =
         (tuple<cmInstallFileSetGenerator_*,_std::default_delete<cmInstallFileSetGenerator>_>)
         (tuple<cmInstallFileSetGenerator_*,_std::default_delete<cmInstallFileSetGenerator>_>)
         extraout_RAX.
         super___uniq_ptr_impl<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmInstallFileSetGenerator_*,_std::default_delete<cmInstallFileSetGenerator>_>
         .super__Head_base<0UL,_cmInstallFileSetGenerator_*,_false>._M_head_impl;
  }
  return (unique_ptr<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>_>)
         _Var1._M_t.
         super__Tuple_impl<0UL,_cmInstallFileSetGenerator_*,_std::default_delete<cmInstallFileSetGenerator>_>
         .super__Head_base<0UL,_cmInstallFileSetGenerator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmInstallFileSetGenerator> CreateInstallFileSetGenerator(
  Helper& helper, cmTarget& target, cmFileSet* fileSet,
  const std::string& destination, const cmInstallCommandArguments& args)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);
  return cm::make_unique<cmInstallFileSetGenerator>(
    target.GetName(), fileSet, destination, args.GetPermissions(),
    args.GetConfigurations(), args.GetComponent(), message,
    args.GetExcludeFromAll(), args.GetOptional(),
    helper.Makefile->GetBacktrace());
}